

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.hpp
# Opt level: O0

int __thiscall common_server_client_setup::init(common_server_client_setup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  SourceLineInfo *this_00;
  sockaddr *__addr;
  StringRef capturedExpression;
  SourceLineInfo local_98;
  StringRef local_88;
  undefined1 local_78 [8];
  AssertionHandler catchAssertionHandler;
  common_server_client_setup *this_local;
  
  bind_ip4_loopback_abi_cxx11_((string *)&catchAssertionHandler.m_resultCapture,&this->server);
  std::__cxx11::string::operator=
            ((string *)&this->endpoint,(string *)&catchAssertionHandler.m_resultCapture);
  std::__cxx11::string::~string((string *)&catchAssertionHandler.m_resultCapture);
  local_88 = operator____catch_sr("REQUIRE_NOTHROW",0xf);
  this_00 = &local_98;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/testutil.hpp",
             0x1b);
  capturedExpression = operator____catch_sr("client.connect(endpoint)",0x18);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_78,local_88,this_00,capturedExpression,Normal);
  zmq::detail::socket_base::connect
            (&(this->client).super_socket_base,(int)this + 0x28,__addr,(socklen_t)this_00);
  Catch::AssertionHandler::handleExceptionNotThrownAsExpected((AssertionHandler *)local_78);
  Catch::AssertionHandler::complete((AssertionHandler *)local_78);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_78);
  return extraout_EAX;
}

Assistant:

void init()
    {
        endpoint = bind_ip4_loopback(server);
        REQUIRE_NOTHROW(client.connect(endpoint));
    }